

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::String,kj::StringPtr&,kj::String>
          (String *__return_storage_ptr__,_ *this,String *params,StringPtr *params_1,
          String *params_2)

{
  size_t sVar1;
  long lVar2;
  size_t size;
  char *target;
  size_t local_38 [3];
  
  size = 0;
  local_38[0] = *(long *)(this + 8) - 1;
  if (*(long *)(this + 8) == 0) {
    local_38[0] = size;
  }
  local_38[1] = (params->content).size_ - 1;
  sVar1 = (params_1->content).size_;
  local_38[2] = sVar1 - 1;
  if (sVar1 == 0) {
    local_38[2] = size;
  }
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_38 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::String,kj::StringPtr&,kj::String>
            (target,(String *)this,(StringPtr *)params,(String *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}